

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O0

bool Grammar::is_keyword_message(string *str)

{
  bool bVar1;
  int iVar2;
  ulong in_RDI;
  int i;
  bool local_99;
  undefined2 in_stack_ffffffffffffff6c;
  byte bVar3;
  byte bVar4;
  string local_90 [32];
  string local_70 [55];
  byte local_39;
  string local_38 [16];
  string *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  int iVar6;
  bool local_1;
  
  bVar1 = is_keyword_message_part(in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_1 = true;
  }
  else {
    iVar5 = 0;
    while (iVar6 = iVar5, iVar2 = std::__cxx11::string::size(), iVar5 < iVar2) {
      std::__cxx11::string::operator[](in_RDI);
      bVar1 = str_utils::is_space('\0');
      local_39 = 0;
      bVar4 = 0;
      bVar3 = 0;
      local_99 = false;
      if (bVar1) {
        std::__cxx11::string::substr((ulong)local_38,in_RDI);
        local_39 = 1;
        bVar1 = is_keyword_message_part(in_stack_ffffffffffffffd8);
        local_99 = false;
        if (bVar1) {
          std::__cxx11::string::substr((ulong)local_90,in_RDI);
          bVar4 = 1;
          str_utils::ltrim((string *)
                           CONCAT17(1,CONCAT16(bVar3,CONCAT24(in_stack_ffffffffffffff6c,iVar5))));
          bVar3 = 1;
          local_99 = is_keyword_message((string *)CONCAT44(iVar6,in_stack_ffffffffffffffe8));
        }
      }
      if ((bVar3 & 1) != 0) {
        std::__cxx11::string::~string(local_70);
      }
      if ((bVar4 & 1) != 0) {
        std::__cxx11::string::~string(local_90);
      }
      if ((local_39 & 1) != 0) {
        std::__cxx11::string::~string(local_38);
      }
      if (local_99 != false) {
        return true;
      }
      iVar5 = iVar6 + 1;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Grammar::is_keyword_message(const std::string& str) {
    if (is_keyword_message_part(str))
        return true;
    for (int i = 0; i < int(str.size()); i++)
        if (str_utils::is_space(str[i]) && is_keyword_message_part(str.substr(0, i)) &&
            is_keyword_message(str_utils::ltrim(str.substr(i + 1))))
            return true;
    return false;
}